

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPValueIteration.cpp
# Opt level: O2

void __thiscall MDPValueIteration::PlanWithCache(MDPValueIteration *this,bool computeIfNotCached)

{
  ostream *poVar1;
  string filenameCache;
  stringstream ss;
  allocator<char> local_1e1;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"GMAA",&local_1e1);
  directories::MADPGetResultsDir
            (&local_1e0,&local_1c0,(PlanningUnit *)(this->super_MDPSolver)._m_pu);
  poVar1 = std::operator<<(local_190,(string *)&local_1e0);
  std::operator<<(poVar1,"/MDPQtable");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  if (this->_m_finiteHorizon == true) {
    poVar1 = std::operator<<(local_190,"_h");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  std::__cxx11::stringbuf::str();
  (*(this->super_MDPSolver)._vptr_MDPSolver[4])(this,&local_1e0,(ulong)computeIfNotCached);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void MDPValueIteration::PlanWithCache(bool computeIfNotCached)
{
    stringstream ss;
    ss << directories::MADPGetResultsDir("GMAA",GetPU()) << "/MDPQtable";
    if(_m_finiteHorizon)
        ss << "_h" << GetPU()->GetHorizon();
    string filenameCache=ss.str();

    PlanWithCache(filenameCache,computeIfNotCached);
}